

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O2

int dsa_priv_encode(CBB *out,EVP_PKEY *key)

{
  DSA *dsa;
  int iVar1;
  int line;
  CBB pkcs8;
  CBB algorithm;
  CBB private_key;
  
  dsa = (DSA *)key->pkey;
  if ((dsa == (DSA *)0x0) || (dsa->priv_key == (BIGNUM *)0x0)) {
    iVar1 = 0x76;
    line = 0x7c;
  }
  else {
    iVar1 = CBB_add_asn1(out,&pkcs8,0x20000010);
    if (((((iVar1 != 0) && (iVar1 = CBB_add_asn1_uint64(&pkcs8,0), iVar1 != 0)) &&
         (iVar1 = CBB_add_asn1(&pkcs8,&algorithm,0x20000010), iVar1 != 0)) &&
        ((iVar1 = CBB_add_asn1_element(&algorithm,6,dsa_asn1_meth.oid,7), iVar1 != 0 &&
         (iVar1 = DSA_marshal_parameters(&algorithm,dsa), iVar1 != 0)))) &&
       ((iVar1 = CBB_add_asn1(&pkcs8,&private_key,4), iVar1 != 0 &&
        ((iVar1 = BN_marshal_asn1(&private_key,dsa->priv_key), iVar1 != 0 &&
         (iVar1 = CBB_flush(out), iVar1 != 0)))))) {
      return 1;
    }
    iVar1 = 0x69;
    line = 0x8a;
  }
  ERR_put_error(6,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                ,line);
  return 0;
}

Assistant:

static int dsa_priv_encode(CBB *out, const EVP_PKEY *key) {
  const DSA *dsa = reinterpret_cast<const DSA *>(key->pkey);
  if (dsa == nullptr || dsa->priv_key == nullptr) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_MISSING_PARAMETERS);
    return 0;
  }

  // See PKCS#11, v2.40, section 2.5.
  CBB pkcs8, algorithm, private_key;
  if (!CBB_add_asn1(out, &pkcs8, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&pkcs8, 0 /* version */) ||
      !CBB_add_asn1(&pkcs8, &algorithm, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_element(&algorithm, CBS_ASN1_OBJECT, dsa_asn1_meth.oid,
                            dsa_asn1_meth.oid_len) ||
      !DSA_marshal_parameters(&algorithm, dsa) ||
      !CBB_add_asn1(&pkcs8, &private_key, CBS_ASN1_OCTETSTRING) ||
      !BN_marshal_asn1(&private_key, dsa->priv_key) || !CBB_flush(out)) {
    OPENSSL_PUT_ERROR(EVP, EVP_R_ENCODE_ERROR);
    return 0;
  }

  return 1;
}